

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_optimizer.cpp
# Opt level: O1

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::optimizeAll
          (pfederc *this,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr,
          size_t *reducedexpressions)

{
  _Head_base<0UL,_pfederc::Expr_*,_false> _Var1;
  Expr *pEVar2;
  pfederc local_40 [8];
  _Head_base<0UL,_pfederc::Expr_*,_false> local_38;
  pfederc local_30 [8];
  Expr *local_28;
  
  optimize(local_40,expr,reducedexpressions);
  if (local_40[0] == (pfederc)0x1) {
    do {
      optimize(local_30,(unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_38,
               reducedexpressions);
      pEVar2 = local_28;
      _Var1._M_head_impl = local_38._M_head_impl;
      local_28 = (Expr *)0x0;
      local_38._M_head_impl = pEVar2;
      if (_Var1._M_head_impl != (Expr *)0x0) {
        (*(_Var1._M_head_impl)->_vptr_Expr[1])();
      }
      local_40[0] = local_30[0];
      if (local_28 != (Expr *)0x0) {
        (*local_28->_vptr_Expr[1])();
      }
    } while (local_40[0] != (pfederc)0x0);
  }
  *(Expr **)this = local_38._M_head_impl;
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> pfederc::optimizeAll(std::unique_ptr<Expr> &&expr,
    size_t &reducedexpressions) noexcept {
  auto tpl = optimize(std::move(expr), reducedexpressions);
  while (std::get<1>(tpl)) {
    tpl = optimize(std::move(std::move(std::get<0>(tpl))), reducedexpressions);
  }

  return std::move(std::get<0>(tpl));
}